

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall jsonnet::internal::anon_unknown_0::Interpreter::~Interpreter(Interpreter *this)

{
  string *this_00;
  _Base_ptr p_Var1;
  
  for (p_Var1 = (this->cachedImports)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var1 != &(this->cachedImports)._M_t._M_impl.super__Rb_tree_header;
      p_Var1 = (_Base_ptr)std::_Rb_tree_increment(p_Var1)) {
    this_00 = *(string **)(p_Var1 + 3);
    if (this_00 != (string *)0x0) {
      std::__cxx11::string::~string(this_00 + 0x20);
      std::__cxx11::string::~string(this_00);
    }
    operator_delete(this_00,0x48);
  }
  std::
  vector<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>,_std::allocator<std::unique_ptr<jsonnet::internal::Identifier,_std::default_delete<jsonnet::internal::Identifier>_>_>_>
  ::~vector(&this->sourceFuncIds);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::(anonymous_namespace)::HeapThunk_*>_>_>
  ::~map(&this->sourceVals);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_jsonnet::internal::AST_*(jsonnet::internal::(anonymous_namespace)::Interpreter::*)(const_jsonnet::internal::LocationRange_&,_const_std::vector<jsonnet::internal::(anonymous_namespace)::Value,_std::allocator<jsonnet::internal::(anonymous_namespace)::Value>_>_&)>_>_>
  ::~map(&this->builtins);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmNativeCallback>_>_>
  ::~_Rb_tree(&(this->nativeCallbacks)._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_jsonnet::internal::VmExt>_>_>
  ::~_Rb_tree(&(this->externalVars)._M_t);
  std::
  map<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*,_std::less<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>_>,_std::allocator<std::pair<const_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_>,_jsonnet::internal::(anonymous_namespace)::Interpreter::ImportCacheValue_*>_>_>
  ::~map(&this->cachedImports);
  Stack::~Stack(&this->stack);
  Heap::~Heap(&this->heap);
  return;
}

Assistant:

~Interpreter()
    {
        for (const auto &pair : cachedImports) {
            delete pair.second;
        }
    }